

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_gmatch(lua_State *L)

{
  long in_RDI;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  lua_State *in_stack_00000010;
  
  lj_lib_checkstr(in_stack_00000010,in_stack_0000000c);
  lj_lib_checkstr(in_stack_00000010,in_stack_0000000c);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x10) + 0x18;
  *(undefined8 *)(*(long *)(in_RDI + 0x18) + -8) = 0;
  lj_lib_pushcc(in_stack_00000010,(lua_CFunction)CONCAT44(in_stack_0000000c,in_stack_00000008),
                L._4_4_,(int)L);
  return 1;
}

Assistant:

LJLIB_CF(string_gmatch)
{
  lj_lib_checkstr(L, 1);
  lj_lib_checkstr(L, 2);
  L->top = L->base+3;
  (L->top-1)->u64 = 0;
  lj_lib_pushcc(L, lj_cf_string_gmatch_aux, FF_string_gmatch_aux, 3);
  return 1;
}